

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O0

uint64_t Data::Sprite::create_id
                   (uint64_t resource,uint64_t index,uint64_t mask_resource,uint64_t mask_index,
                   Color *color)

{
  uint64_t result;
  Color *color_local;
  uint64_t mask_index_local;
  uint64_t mask_resource_local;
  uint64_t index_local;
  uint64_t resource_local;
  
  return (long)(int)(uint)color->blue |
         (long)(int)(uint)color->green << 8 |
         (long)(int)(uint)color->red << 0x10 |
         (mask_index & 0xfff) << 0x18 |
         (mask_resource & 0xff) << 0x24 | (index & 0xfff) << 0x2c | resource << 0x38;
}

Assistant:

uint64_t
Data::Sprite::create_id(uint64_t resource, uint64_t index,
                        uint64_t mask_resource, uint64_t mask_index,
                        const Sprite::Color &color) {
  // 0xFF00000000000000
  uint64_t result = static_cast<uint64_t>(resource & 0xFF) << 56;
  // 0x00FFF00000000000
  result |= static_cast<uint64_t>(index & 0xFFF) << 44;
  // 0x00000FF000000000
  result |= static_cast<uint64_t>(mask_resource & 0xFF) << 36;
  // 0x0000000FFF000000
  result |= static_cast<uint64_t>(mask_index & 0xFFF) << 24;
  // 0x0000000000FF0000
  result |= static_cast<uint64_t>(color.red & 0xFF) << 16;
  // 0x000000000000FF00
  result |= static_cast<uint64_t>(color.green & 0xFF) << 8;
  // 0x00000000000000FF
  result |= static_cast<uint64_t>(color.blue & 0xFF) << 0;
  return result;
}